

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,char *newFlags)

{
  allocator local_39;
  string local_38 [32];
  
  if ((newFlags != (char *)0x0) && (*newFlags != '\0')) {
    std::__cxx11::string::string(local_38,newFlags,&local_39);
    (*this->_vptr_cmLocalGenerator[5])(this,flags,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const char* newFlags)
{
  if(newFlags && *newFlags)
    {
    this->AppendFlags(flags, std::string(newFlags));
    }
}